

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::Stepper::_q_autorepeat(Stepper *this)

{
  uint uVar1;
  StepperPrivate *this_00;
  
  this_00 = (this->d).d;
  uVar1 = this_00->autorepeatCount + 1;
  this_00->autorepeatCount = uVar1;
  if (uVar1 == 5) {
    this_00->timeout = 0xfa;
    QTimer::stop();
    QTimer::start((int)((this->d).d)->timer);
    this_00 = (this->d).d;
  }
  StepperPrivate::makeClick(this_00);
  return;
}

Assistant:

void
Stepper::_q_autorepeat()
{
	++d->autorepeatCount;

	if( d->autorepeatCount == autorepeatChangeTimeoutCount )
	{
		d->timeout = fastTimeout;

		d->timer->stop();

		d->timer->start( d->timeout );
	}

	d->makeClick();
}